

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O2

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>>::
applyHouseholderOnTheRight<Eigen::Matrix<double,2,1,0,2,1>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>> *this,
          Matrix<double,_2,_1,_0,_2,_1> *essential,Scalar *tau,Scalar *workspace)

{
  Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_> tmp;
  Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_> local_108;
  Scalar local_f0;
  undefined1 local_e8 [32];
  scalar_multiple_op<double> sStack_c8;
  type local_c0;
  Nested pMStack_b8;
  double local_b0;
  double dStack_a8;
  Matrix<double,_2,_1,_0,_2,_1> *local_a0;
  DenseIndex local_98;
  undefined8 local_88;
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false> right;
  
  if (*(long *)(this + 0x10) == 1) {
    local_e8._0_8_ = 1.0 - *tau;
    DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>_>::operator*=
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>_> *)this
               ,(Scalar *)local_e8);
  }
  else {
    MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::MapBase
              ((MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)&tmp,workspace,*(Index *)(this + 8));
    Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_2,_false>::Block
              (&right,(Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false> *)this,0,1,
               *(Index *)(this + 8),*(long *)(this + 0x10) + -1);
    local_e8._0_8_ =
         right.
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false>,_0>
         .m_data;
    local_e8._8_8_ =
         right.
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false>,_0>
         .m_rows.m_value;
    local_e8._24_8_ =
         right.
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false,_true>
         .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_0>.m_data;
    sStack_c8.m_other =
         (type)right.
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false,_true>
               .m_xpr.
               super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_0>.
               m_rows.m_value;
    local_c0.m_matrix =
         (Nested)right.
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false,_true>
                 .m_xpr.
                 super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_0>
                 .m_cols.m_value;
    pMStack_b8 = right.
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false,_true>
                 .m_xpr.
                 super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
                 m_xpr;
    local_b0 = (double)right.
                       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false,_true>
                       .m_xpr.
                       super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>
                       .m_outerStride;
    dStack_a8 = (double)right.
                        super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false,_true>
                        .m_outerStride;
    local_88 = 0;
    local_a0 = essential;
    DenseBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,2,1>,0,Eigen::Stride<0,0>>>::
    lazyAssign<Eigen::CoeffBasedProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,2,false>const,Eigen::Matrix<double,2,1,0,2,1>const&,6>>
              ((DenseBase<Eigen::Map<Eigen::Matrix<double,_1,1,0,2,1>,0,Eigen::Stride<0,0>>> *)&tmp,
               (DenseBase<Eigen::CoeffBasedProduct<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_2,_false>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&,_6>_>
                *)local_e8);
    Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_1,_true>::Block
              ((Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_true>
                *)local_e8,(Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false> *)this,0);
    MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,2,1>,0,Eigen::Stride<0,0>>>::operator+=
              ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,1,0,2,1>,0,Eigen::Stride<0,0>>> *)&tmp
               ,(MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_true>_>
                 *)local_e8);
    local_f0 = *tau;
    local_108._0_8_ = tmp._0_8_;
    local_108._8_8_ = tmp._8_8_;
    Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_1,_true>::Block
              ((Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_true>
                *)local_e8,(Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false> *)this,0);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>,-1,1,true>>::
    operator-=((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,1,true>>
                *)local_e8,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)&local_108);
    sStack_c8.m_other = *tau;
    local_e8._8_8_ = tmp._0_8_;
    local_e8._16_8_ = tmp._8_8_;
    local_98 = 0;
    local_108._0_8_ = &right;
    local_c0.m_matrix = essential;
    NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>,-1,2,false>,Eigen::MatrixBase>
    ::operator-=((NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,2,false>,Eigen::MatrixBase>
                  *)&local_108,
                 (CoeffBasedProduct<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_256>
                  *)local_e8);
  }
  return;
}

Assistant:

void MatrixBase<Derived>::applyHouseholderOnTheRight(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(cols() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else
  {
    Map<typename internal::plain_col_type<PlainObject>::type> tmp(workspace,rows());
    Block<Derived, Derived::RowsAtCompileTime, EssentialPart::SizeAtCompileTime> right(derived(), 0, 1, rows(), cols()-1);
    tmp.noalias() = right * essential.conjugate();
    tmp += this->col(0);
    this->col(0) -= tau * tmp;
    right.noalias() -= tau * tmp * essential.transpose();
  }
}